

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::RemoveElement<Memory::HeapAllocator>
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *this,
          HeapAllocator *allocator,GuestArenaAllocator *element)

{
  code *pcVar1;
  bool bVar2;
  DListNode<Memory::Recycler::GuestArenaAllocator> *pDVar3;
  undefined4 *puVar4;
  void **buffer;
  
  buffer = &element[-1].super_ArenaAllocator.
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList;
  pDVar3 = (DListNode<Memory::Recycler::GuestArenaAllocator> *)this;
  do {
    pDVar3 = (pDVar3->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.node;
    if (pDVar3 == (DListNode<Memory::Recycler::GuestArenaAllocator> *)this) break;
  } while (pDVar3 != (DListNode<Memory::Recycler::GuestArenaAllocator> *)buffer);
  if (pDVar3 == (DListNode<Memory::Recycler::GuestArenaAllocator> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  **(undefined8 **)&element[-1].pendingDelete = *buffer;
  *(undefined8 *)((long)*buffer + 8) = *(undefined8 *)&element[-1].pendingDelete;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)element);
  Memory::HeapAllocator::Free(allocator,buffer,0x98);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }